

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_OUTCOME_HANDLE sasl_outcome_clone(SASL_OUTCOME_HANDLE value)

{
  AMQP_VALUE pAVar1;
  SASL_OUTCOME_HANDLE local_18;
  SASL_OUTCOME_INSTANCE *sasl_outcome_instance;
  SASL_OUTCOME_HANDLE value_local;
  
  local_18 = (SASL_OUTCOME_HANDLE)malloc(8);
  if (local_18 != (SASL_OUTCOME_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (SASL_OUTCOME_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

SASL_OUTCOME_HANDLE sasl_outcome_clone(SASL_OUTCOME_HANDLE value)
{
    SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)malloc(sizeof(SASL_OUTCOME_INSTANCE));
    if (sasl_outcome_instance != NULL)
    {
        sasl_outcome_instance->composite_value = amqpvalue_clone(((SASL_OUTCOME_INSTANCE*)value)->composite_value);
        if (sasl_outcome_instance->composite_value == NULL)
        {
            free(sasl_outcome_instance);
            sasl_outcome_instance = NULL;
        }
    }

    return sasl_outcome_instance;
}